

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

void __thiscall Shell::parseModuleAssertion(Shell *this,Element *s)

{
  Function *import_00;
  DataSegment *import_01;
  Importable *pIVar1;
  byte bVar2;
  int iVar3;
  Element *pEVar4;
  bool *pbVar5;
  char *extraout_RDX;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_2;
  pointer puVar9;
  char *pcVar10;
  anon_class_16_2_4322515e visitor;
  SExpressionWasmBuilder local_790 [608];
  undefined1 local_530 [8];
  Module wasm;
  undefined1 local_1d8 [376];
  char *local_60;
  Shell *local_58;
  __uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  local_50;
  unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  builder;
  anon_class_16_2_42fb14a4 reportUnknownImport;
  bool invalid;
  
  ::wasm::Module::Module((Module *)local_530);
  wasm.debugInfoFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1efff;
  local_50._M_t.
  super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl =
       (tuple<wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>)
       (_Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
        )0x0;
  ::wasm::Element::operator[]((uint)s);
  ::wasm::Element::str();
  reportUnknownImport.invalid._7_1_ = 0;
  pEVar4 = (Element *)::wasm::Element::operator[]((uint)s);
  pbVar5 = (bool *)0x0;
  ::wasm::SExpressionWasmBuilder::SExpressionWasmBuilder
            (local_790,(Module *)local_530,pEVar4,Normal);
  ::wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder(local_790);
  if (reportUnknownImport.invalid._7_1_ == 0) {
    bVar2 = ::wasm::WasmValidator::validate
                      ((Module *)&wasm.tagsMap._M_h._M_single_bucket,(uint)local_530);
    reportUnknownImport.invalid._7_1_ = bVar2 ^ 1;
  }
  pcVar10 = extraout_RDX;
  if ((reportUnknownImport.invalid._7_1_ == 0) &&
     (extraout_RDX == ASSERT_UNLINKABLE.super_IString.str._M_str)) {
    reportUnknownImport.this = (Shell *)((long)&reportUnknownImport.invalid + 7);
    builder._M_t.
    super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
    .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>,_true,_true>
          )(__uniq_ptr_data<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>,_true,_true>
            )this;
    if (wasm.functions.
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.globals.
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar6 = wasm.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)this;
      do {
        import_00 = (puVar6->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(import_00->super_Importable).module + 8) != (char *)0x0) {
          parseModuleAssertion::anon_class_16_2_42fb14a4::operator()
                    ((anon_class_16_2_42fb14a4 *)&wasm.tagsMap._M_h._M_single_bucket,
                     &import_00->super_Importable);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != (pointer)wasm.globals.
                                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
    wasm.tagsMap._M_h._M_single_bucket =
         (__node_base_ptr)
         builder._M_t.
         super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
         .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl;
    if (wasm.dataSegments.
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.tables.
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar7 = wasm.dataSegments.
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        import_01 = (puVar7->_M_t).
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (*(char **)((long)&(import_01->memory).super_IString + 8) != (char *)0x0) {
          parseModuleAssertion::anon_class_16_2_42fb14a4::operator()
                    ((anon_class_16_2_42fb14a4 *)&wasm.tagsMap._M_h._M_single_bucket,
                     (Importable *)import_01);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != (pointer)wasm.tables.
                                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
    local_60 = extraout_RDX;
    local_58 = this;
    if (wasm.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar9 = wasm.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pIVar1 = (Importable *)
                 (puVar9->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        pcVar10 = *(char **)((long)&pIVar1->module + 8);
        if ((pcVar10 != (char *)0x0) &&
           (((pcVar10 != _divF32x4 || ((pIVar1->base).super_IString.str._M_len < ::wasm::PRINT)) ||
            ((::wasm::PRINT != 0 &&
             (iVar3 = bcmp(*(char **)((long)&(pIVar1->base).super_IString.str + 8),
                           _extendLowUToI32x4,::wasm::PRINT), iVar3 != 0)))))) {
          parseModuleAssertion::anon_class_16_2_42fb14a4::operator()
                    ((anon_class_16_2_42fb14a4 *)&builder,pIVar1);
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != (pointer)wasm.functions.
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
    visitor.invalid = pbVar5;
    visitor.wasm = (Module *)((long)&reportUnknownImport.invalid + 7);
    ::wasm::ElementUtils::
    iterAllElementFunctionNames<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Name)_1_>
              ((ElementUtils *)local_530,(Module *)local_530,visitor);
    this = local_58;
    pcVar10 = local_60;
    wasm.tagsMap._M_h._M_single_bucket =
         (__node_base_ptr)
         builder._M_t.
         super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
         .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl;
    if (wasm.elementSegments.
        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)wasm.memories.
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar8 = wasm.elementSegments.
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pIVar1 = (Importable *)
                 (puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(char **)((long)&pIVar1->module + 8) != (char *)0x0) {
          parseModuleAssertion::anon_class_16_2_42fb14a4::operator()
                    ((anon_class_16_2_42fb14a4 *)&wasm.tagsMap._M_h._M_single_bucket,pIVar1);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != (pointer)wasm.memories.
                                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((reportUnknownImport.invalid._7_1_ == 0) && (pcVar10 == ASSERT_TRAP.super_IString.str._M_str))
  {
    instantiate(this,(Module *)local_530);
  }
  if (reportUnknownImport.invalid._7_1_ != 0) {
    std::
    unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>::
    ~unique_ptr((unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                 *)&local_50);
    ::wasm::Module::~Module((Module *)local_530);
    return;
  }
  Colors::outputColorCode((ostream *)&std::cerr,"\x1b[31m");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[should have been invalid]\n",0x1b);
  Colors::outputColorCode((ostream *)&std::cerr,"\x1b[0m");
  ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
  std::ostream::_M_insert<void_const*>(local_1d8);
  builder._M_t.
  super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._0_1_ = 10;
  ::wasm::Fatal::operator<<((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,(char *)&builder);
  ::wasm::Fatal::~Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
}

Assistant:

void parseModuleAssertion(Element& s) {
    Module wasm;
    wasm.features = FeatureSet::All;
    std::unique_ptr<SExpressionWasmBuilder> builder;
    auto id = s[0]->str();

    bool invalid = false;
    try {
      SExpressionWasmBuilder(wasm, *s[1], IRProfile::Normal);
    } catch (const ParseException&) {
      invalid = true;
    }

    if (!invalid) {
      // maybe parsed ok, but otherwise incorrect
      invalid = !WasmValidator().validate(wasm);
    }

    if (!invalid && id == ASSERT_UNLINKABLE) {
      // validate "instantiating" the mdoule
      auto reportUnknownImport = [&](Importable* import) {
        auto it = linkedInstances.find(import->module);
        if (it == linkedInstances.end() ||
            it->second->wasm.getExportOrNull(import->base) == nullptr) {
          std::cerr << "unknown import: " << import->module << '.'
                    << import->base << '\n';
          invalid = true;
        }
      };
      ModuleUtils::iterImportedGlobals(wasm, reportUnknownImport);
      ModuleUtils::iterImportedTables(wasm, reportUnknownImport);
      ModuleUtils::iterImportedFunctions(wasm, [&](Importable* import) {
        if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
          // We can handle it.
        } else {
          reportUnknownImport(import);
        }
      });
      ElementUtils::iterAllElementFunctionNames(&wasm, [&](Name name) {
        // spec tests consider it illegal to use spectest.print in a table
        if (auto* import = wasm.getFunction(name)) {
          if (import->imported() && import->module == SPECTEST &&
              import->base.startsWith(PRINT)) {
            std::cerr << "cannot put spectest.print in table\n";
            invalid = true;
          }
        }
      });
      ModuleUtils::iterImportedMemories(wasm, reportUnknownImport);
    }

    if (!invalid && id == ASSERT_TRAP) {
      try {
        instantiate(&wasm);
      } catch (const TrapException&) {
        invalid = true;
      } catch (const WasmException& e) {
        std::cout << "[exception thrown: " << e << "]" << std::endl;
        invalid = true;
      }
    }

    if (!invalid) {
      Colors::red(std::cerr);
      std::cerr << "[should have been invalid]\n";
      Colors::normal(std::cerr);
      Fatal() << &wasm << '\n';
    }
  }